

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_next.c
# Opt level: O0

mpt_node * mpt_node_next(mpt_node *curr,char *ident)

{
  int iVar1;
  size_t sVar2;
  void *__s2;
  ulong local_40;
  size_t clen;
  void *cid;
  size_t idlen;
  char *ident_local;
  mpt_node *curr_local;
  
  ident_local = (char *)curr;
  if (ident == (char *)0x0) {
    local_40 = 0;
  }
  else {
    sVar2 = strlen(ident);
    local_40 = sVar2 + 1;
  }
  while( true ) {
    if (ident_local == (char *)0x0) {
      return (mpt_node *)0x0;
    }
    __s2 = mpt_identifier_data((mpt_identifier *)(ident_local + 0x28));
    if (((local_40 == *(ushort *)(ident_local + 0x28)) && (ident_local[0x2a] == '\x01')) &&
       ((local_40 == 0 || (iVar1 = memcmp(ident,__s2,local_40 - 1), iVar1 == 0)))) break;
    ident_local = *(char **)(ident_local + 8);
  }
  return (mpt_node *)ident_local;
}

Assistant:

extern MPT_STRUCT(node) *mpt_node_next(const MPT_STRUCT(node) *curr, const char *ident)
{
	size_t idlen;
	
	idlen = ident ? strlen(ident) + 1 : 0;
	
	while (curr) {
		const void *cid;
		size_t clen;
		
		cid  = mpt_identifier_data(&curr->ident);
		clen = curr->ident._len;
		if (idlen == clen
		    && curr->ident._charset == MPT_CHARSET(UTF8)
		    && (!idlen || !memcmp(ident, cid, idlen - 1))) {
			return (MPT_STRUCT(node) *) curr;
		}
		curr = curr->next;
	}
	return 0;
}